

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DeleteFromAEL(Clipper *this,TEdge *e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *AelNext;
  TEdge *AelPrev;
  TEdge *e_local;
  Clipper *this_local;
  
  pTVar1 = e->prevInAEL;
  pTVar2 = e->nextInAEL;
  if (((pTVar1 != (TEdge *)0x0) || (pTVar2 != (TEdge *)0x0)) || (e == this->m_ActiveEdges)) {
    if (pTVar1 == (TEdge *)0x0) {
      this->m_ActiveEdges = pTVar2;
    }
    else {
      pTVar1->nextInAEL = pTVar2;
    }
    if (pTVar2 != (TEdge *)0x0) {
      pTVar2->prevInAEL = pTVar1;
    }
    e->nextInAEL = (TEdge *)0x0;
    e->prevInAEL = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::DeleteFromAEL(TEdge *e)
{
  TEdge* AelPrev = e->prevInAEL;
  TEdge* AelNext = e->nextInAEL;
  if(  !AelPrev &&  !AelNext && (e != m_ActiveEdges) ) return; //already deleted
  if( AelPrev ) AelPrev->nextInAEL = AelNext;
  else m_ActiveEdges = AelNext;
  if( AelNext ) AelNext->prevInAEL = AelPrev;
  e->nextInAEL = 0;
  e->prevInAEL = 0;
}